

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

size_t __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::GatherLMons
          (MI<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyMons)

{
  _List_node_base *p_Var1;
  
  std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::clear
            (&polyMons->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
  p_Var1 = (_List_node_base *)this;
  while (p_Var1 = (((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                     *)&p_Var1->_M_next)->
                  super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this
        ) {
    MP<45UL,_GF2::MOGrlex<45UL>_>::Union(polyMons,(MM<45UL> *)(*(long *)(p_Var1 + 1) + 0x10));
  }
  return (polyMons->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>).
         super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size;
}

Assistant:

size_t GatherLMons(MP<_n, _O>& polyMons) const
	{	
		// согласованный?
		assert(IsConsistent(polyMons));
		polyMons.SetEmpty();
		for (const_iterator iter = begin(); iter != end(); ++iter)
			polyMons.Union(iter->LM());
		return polyMons.Size();
	}